

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlenc.h
# Opt level: O2

size_t __thiscall
cali::CompressedSnapshotRecord::append
          (CompressedSnapshotRecord *this,size_t n,cali_id_t *attr_vec,Variant *data_vec)

{
  size_t sVar1;
  size_t sVar2;
  Variant *this_00;
  size_t __n;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  size_t local_c8;
  uchar tmp [120];
  
  local_c8 = 0;
  do {
    if (n == 0) {
      this->m_skipped = this->m_skipped + local_c8;
      return local_c8;
    }
    uVar3 = 4;
    if (n < 4) {
      uVar3 = n;
    }
    __n = 0;
    this_00 = data_vec;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      sVar1 = vlenc_u64(attr_vec[uVar4],tmp + __n);
      sVar2 = Variant::pack(this_00,tmp + sVar1 + __n);
      __n = sVar2 + sVar1 + __n;
      this_00 = this_00 + 1;
    }
    if (this->m_num_imm + uVar3 < 0x80) {
      if (this->m_buffer_len < this->m_imm_pos + __n + this->m_imm_len) goto LAB_001b75c9;
      memcpy(this->m_buffer + this->m_imm_len + this->m_imm_pos,tmp,__n);
      this->m_imm_len = this->m_imm_len + __n;
      this->m_num_imm = this->m_num_imm + uVar3;
      this->m_buffer[this->m_imm_pos] = this->m_buffer[this->m_imm_pos] + (char)uVar3;
    }
    else {
LAB_001b75c9:
      local_c8 = local_c8 + uVar3;
    }
    this->m_needed_len = this->m_needed_len + __n;
    attr_vec = attr_vec + uVar3;
    n = n - uVar3;
    data_vec = data_vec + uVar3;
  } while( true );
}

Assistant:

inline uint64_t vldec_u64(const unsigned char* buf, size_t* inc)
{
    uint64_t val = 0;
    size_t   p   = 0;

    for (; p < 9 && (buf[p] & 0x80); ++p)
        val |= ((uint64_t) (buf[p] & 0x7F) << (7 * p));

    val |= ((uint64_t) (buf[p] & 0x7F) << (7 * p));
    ++p;

    *inc += p;

    return val;
}